

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dsa_asn1.cc
# Opt level: O1

int dup_bn_into(BIGNUM **out,BIGNUM *src)

{
  BIGNUM *pBVar1;
  
  pBVar1 = BN_dup((BIGNUM *)src);
  if (pBVar1 != (BIGNUM *)0x0) {
    BN_free((BIGNUM *)*out);
    *out = (BIGNUM *)pBVar1;
  }
  return (uint)(pBVar1 != (BIGNUM *)0x0);
}

Assistant:

static int dup_bn_into(BIGNUM **out, BIGNUM *src) {
  bssl::UniquePtr<BIGNUM> a(BN_dup(src));
  if (a == nullptr) {
    return 0;
  }
  BN_free(*out);
  *out = a.release();
  return 1;
}